

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames
               (ON_SimpleArray<const_ON_Font_*> *device_list)

{
  byte bVar1;
  ON_Font *pOVar2;
  long lVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined1 *puVar8;
  uint uVar9;
  ON_wString *pOVar10;
  bool bVar11;
  ON_wString *pOVar12;
  int iVar13;
  wchar_t *pwVar14;
  uint uVar15;
  ulong uVar16;
  ON_Font *f;
  ON_wString fake_en_logfont_name;
  ON_SimpleArray<const_ON_Font_*> quartet_candidates;
  ON_wString en_name;
  ON_wString loc_name;
  ON_wString local_d0;
  ON_wString local_c8;
  ON_wString *local_c0;
  ON_wString *local_b8;
  undefined1 local_b0 [32];
  ON_wString local_90;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString local_38;
  
  local_b0._24_8_ = ZEXT48((uint)device_list->m_count);
  if ((wchar_t *)local_b0._24_8_ != (wchar_t *)0x0) {
    pwVar14 = (wchar_t *)0x0;
    do {
      pOVar2 = device_list->m_a[(long)pwVar14];
      if (pOVar2 != (ON_Font *)0x0) {
        pOVar12 = &pOVar2->m_loc_family_name;
        local_b8 = &pOVar2->m_en_family_name;
        bVar5 = ON_wString::IsNotEmpty(pOVar12);
        pOVar10 = pOVar12;
        if (!bVar5) {
          pOVar10 = local_b8;
        }
        local_90.m_s = (wchar_t *)pOVar12;
        ON_wString::ON_wString(&local_48,pOVar10);
        bVar5 = ON_wString::IsNotEmpty(&pOVar2->m_loc_postscript_name);
        local_c0 = &pOVar2->m_en_postscript_name;
        pOVar12 = &pOVar2->m_loc_postscript_name;
        if (!bVar5) {
          pOVar12 = local_c0;
        }
        ON_wString::ON_wString(&local_50,pOVar12);
        ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                  ((ON_Font *)local_b0,&local_48,&local_50);
        ON_wString::~ON_wString(&local_50);
        ON_wString::~ON_wString(&local_48);
        bVar5 = ON_wString::IsEmpty((ON_wString *)local_b0);
        if (!bVar5) {
          ON_wString::ON_wString(&local_58,local_b8);
          ON_wString::ON_wString(&local_38,local_c0);
          ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                    ((ON_Font *)&local_c8,&local_58,&local_38);
          ON_wString::~ON_wString(&local_38);
          ON_wString::~ON_wString(&local_58);
          bVar5 = ON_wString::IsEmpty(&local_c8);
          if (bVar5) {
            ON_wString::operator=(&local_c8,(ON_wString *)local_b0);
          }
          else {
            bVar5 = ON_wString::EqualOrdinal((ON_wString *)local_b0,&local_c8,true);
            if (!bVar5) {
              bVar5 = ON_wString::IsNotEmpty((ON_wString *)local_90.m_s);
              if (!bVar5) {
                local_90.m_s = (wchar_t *)local_b8;
              }
              ON_wString::ON_wString(&local_d0,(ON_wString *)local_90.m_s);
              bVar5 = ON_wString::EqualOrdinal((ON_wString *)local_b0,&local_d0,true);
              local_c0 = (ON_wString *)CONCAT71(local_c0._1_7_,bVar5);
              ON_wString::~ON_wString(&local_d0);
              ON_wString::ON_wString(&local_d0,local_b8);
              pOVar12 = &local_c8;
              bVar5 = ON_wString::EqualOrdinal(pOVar12,&local_d0,true);
              ON_wString::~ON_wString(&local_d0);
              pOVar10 = (ON_wString *)local_b0;
              if ((char)local_c0 != '\x01' || bVar5) {
                pOVar10 = &local_c8;
                pOVar12 = (ON_wString *)local_b0;
                if ((char)local_c0 != '\0' || !bVar5) goto LAB_0048f00d;
              }
              ON_wString::operator=(pOVar10,pOVar12);
            }
          }
LAB_0048f00d:
          ON_wString::ON_wString(&local_70,(ON_wString *)local_b0);
          ON_wString::ON_wString(&local_60,&local_c8);
          ON_wString::operator=(&pOVar2->m_loc_windows_logfont_name,&local_70);
          ON_wString::operator=(&pOVar2->m_en_windows_logfont_name,&local_60);
          ON_wString::~ON_wString(&local_60);
          ON_wString::~ON_wString(&local_70);
          ON_wString::~ON_wString(&local_c8);
        }
        ON_wString::~ON_wString((ON_wString *)local_b0);
      }
      pwVar14 = (wchar_t *)((long)pwVar14 + 1);
    } while ((wchar_t *)local_b0._24_8_ != pwVar14);
  }
  ON_SimpleArray<const_ON_Font_*>::QuickSort
            (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
  local_b0._0_8_ = &PTR__ON_SimpleArray_0081e920;
  local_b0._8_8_ = (wchar_t *)0x0;
  local_b0._16_8_ = (wchar_t *)0x0;
  ON_SimpleArray<const_ON_Font_*>::SetCapacity((ON_SimpleArray<const_ON_Font_*> *)local_b0,0x80);
  if ((wchar_t *)local_b0._24_8_ != (wchar_t *)0x0) {
    bVar5 = false;
    uVar16 = 0;
    local_68.m_s = (wchar_t *)device_list;
    do {
      uVar15 = (uint)uVar16;
      local_c8.m_s = (wchar_t *)device_list->m_a[uVar16];
      if ((ON_Font *)local_c8.m_s != (ON_Font *)0x0) {
        if (-1 < (long)local_b0._16_8_) {
          local_b0._16_8_ = local_b0._16_8_ & 0xffffffff00000000;
        }
        ON_SimpleArray<const_ON_Font_*>::Append
                  ((ON_SimpleArray<const_ON_Font_*> *)local_b0,(ON_Font **)&local_c8);
        do {
          uVar15 = (uint)uVar16;
          uVar9 = uVar15 + 1;
          if ((uint)local_b0._24_4_ <= uVar9) break;
          local_d0.m_s = (wchar_t *)device_list->m_a[uVar9];
          if (((ON_Font *)local_d0.m_s == (ON_Font *)0x0) ||
             (iVar6 = ON_FontList::CompareFamilyAndWindowsLogfontName
                                ((ON_Font **)&local_c8,(ON_Font **)&local_d0), iVar6 != 0)) {
            bVar11 = false;
            uVar9 = uVar15;
          }
          else {
            bVar11 = true;
            ON_SimpleArray<const_ON_Font_*>::Append
                      ((ON_SimpleArray<const_ON_Font_*> *)local_b0,(ON_Font **)&local_d0);
          }
          uVar16 = (ulong)uVar9;
          uVar15 = uVar9;
        } while (bVar11);
        uVar4 = local_b0._16_4_;
        pOVar12 = (ON_wString *)(local_b0._16_8_ & 0xffffffff);
        if ((ON_wString *)0x1 < pOVar12) {
          if (1 < (int)local_b0._16_4_ && (wchar_t *)local_b0._8_8_ != (wchar_t *)0x0) {
            ON_qsort((void *)local_b0._8_8_,(size_t)pOVar12,8,ON_FontList::CompareStretch);
          }
          uVar9 = (uint)*(byte *)(*(long *)local_b0._8_8_ + 0x1a);
          iVar7 = 5 - (uint)*(byte *)(*(long *)local_b0._8_8_ + 0x1a);
          iVar6 = -iVar7;
          if (0 < iVar7) {
            iVar6 = iVar7;
          }
          if ((uint)uVar4 < 2) {
            pOVar12 = (ON_wString *)0x1;
          }
          puVar8 = (undefined1 *)0x0;
          bVar11 = false;
          do {
            iVar13 = 5 - (uint)*(byte *)(*(long *)(local_b0._8_8_ + (long)puVar8 * 2 * 4) + 0x1a);
            iVar7 = -iVar13;
            if (0 < iVar13) {
              iVar7 = iVar13;
            }
            if (iVar7 < iVar6) {
              bVar11 = true;
              uVar9 = (uint)*(byte *)(*(long *)(local_b0._8_8_ + (long)puVar8 * 2 * 4) + 0x1a);
              iVar6 = iVar7;
            }
            puVar8 = puVar8 + 1;
          } while (pOVar12 != (ON_wString *)puVar8);
          device_list = (ON_SimpleArray<const_ON_Font_*> *)local_68.m_s;
          local_b8 = pOVar12;
          if (bVar11) {
            puVar8 = (undefined1 *)0x0;
            do {
              lVar3 = *(long *)(local_b0._8_8_ + (long)puVar8 * 2 * 4);
              bVar1 = *(byte *)(lVar3 + 0x1a);
              if (bVar1 != (byte)uVar9) {
                ON_wString::ON_wString(&local_d0,L" (");
                pwVar14 = L"";
                if (bVar1 < 10) {
                  pwVar14 = (wchar_t *)(&PTR_anon_var_dwarf_25c401_0081e8c0)[bVar1];
                }
                ON_wString::operator+=(&local_d0,pwVar14);
                iVar6 = ON_wString::Length(&local_d0);
                if (2 < iVar6) {
                  ON_wString::operator+=(&local_d0,L")");
                  local_c0 = (ON_wString *)(lVar3 + 0x58);
                  ON_wString::operator+(&local_78,local_c0);
                  ON_wString::operator+(&local_80,(ON_wString *)(lVar3 + 0x60));
                  ON_wString::ON_wString(&local_40,&local_78);
                  ON_wString::ON_wString(&local_88,&local_80);
                  if (lVar3 != 0) {
                    ON_wString::operator=(local_c0,&local_40);
                    ON_wString::operator=((ON_wString *)(lVar3 + 0x60),&local_88);
                  }
                  ON_wString::~ON_wString(&local_88);
                  ON_wString::~ON_wString(&local_40);
                  ON_wString::~ON_wString(&local_80);
                  ON_wString::~ON_wString(&local_78);
                  bVar5 = true;
                }
                ON_wString::~ON_wString(&local_d0);
              }
              puVar8 = puVar8 + 1;
              device_list = (ON_SimpleArray<const_ON_Font_*> *)local_68.m_s;
            } while (local_b8 != (ON_wString *)puVar8);
          }
        }
      }
      uVar16 = (ulong)(uVar15 + 1);
    } while (uVar15 + 1 < (uint)local_b0._24_4_);
    if (bVar5) {
      ON_SimpleArray<const_ON_Font_*>::QuickSort
                (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
    }
  }
  ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_b0);
  return;
}

Assistant:

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames(
  ON_SimpleArray<const ON_Font*>& device_list
)
{
  // Windows divides font families (which can have many faces) 
  // into LOGFONT subsets identified by a logfont name.
  // A LOGFONT subset can have at most 4 faces and typically 
  // they are regular/bold/italic/bold-italic variations of 
  // a face and all have matching stretch.
  //
  // This all goes back to the 1970's and early user interfaces
  // that selected fonts based on a name, bold=true/false, italic=true/false
  // style inteface. This type of archaic font selection interface is way 
  // too simple to accomodate the rich font families are currently in use.
  // Newer font families can have dozens of faces with severeal weights,
  // several widths, and an upright and italic version of each of these.
  // However, that does not prevent applications like Rhino 6/7 
  // from attempting to use the inadequate and archic bold/italic font
  // selection interface to select a font from a rich list of modern fonts.
  //
  // This function is used on non Windows platforms to partition 
  // the installed font families into subsets with the same
  // width and set a unique fake LOGFONT name. Later sorting will
  // choose up to four faces from each subset to use as the 
  // regular/bold/italic/bold-italic representatives.

  // Assign a fake logfont name.
  const unsigned int font_count = device_list.UnsignedCount();
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    ON_wString fake_loc_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::LocalizedFirst),
      f0->PostScriptName(ON_Font::NameLocale::LocalizedFirst)
    );
    if (fake_loc_logfont_name.IsEmpty())
      continue;
    ON_wString fake_en_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::English),
      f0->PostScriptName(ON_Font::NameLocale::English)
    );
    if (fake_en_logfont_name.IsEmpty())
      fake_en_logfont_name = fake_loc_logfont_name;
    else if (false == fake_loc_logfont_name.EqualOrdinal(fake_en_logfont_name, true))
    {
      const bool bLocalFaceIsFamilyName = fake_loc_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::LocalizedFirst), true);
      const bool bEnglishFaceIsFamilyName = fake_en_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::English), true);
      if (bLocalFaceIsFamilyName && false == bEnglishFaceIsFamilyName)
        fake_loc_logfont_name = fake_en_logfont_name;
      else if (bEnglishFaceIsFamilyName && false == bLocalFaceIsFamilyName)
        fake_en_logfont_name = fake_loc_logfont_name;
    }

    ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(
      f0,
      fake_loc_logfont_name,
      fake_en_logfont_name
    );
  }

  // Sort device_list by font family and current fake LOGFONT name
  device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);
  ON_SimpleArray<const ON_Font*> quartet_candidates(128);
  bool bSortAgain = false;
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    quartet_candidates.SetCount(0);
    quartet_candidates.Append(f0);
    while( (i + 1) < font_count )
    {
      const ON_Font* f = device_list[i + 1];
      if (nullptr == f || 0 != ON_FontList::CompareFamilyAndWindowsLogfontName(&f0, &f))
        break;
      quartet_candidates.Append(f);
      ++i;
    }
    const unsigned int quartet_candidate_count = quartet_candidates.UnsignedCount();
    if (quartet_candidate_count < 2)
      continue;

    // members in a fake LOGFONT quartet should have the same stretch
    quartet_candidates.QuickSort(ON_FontList::CompareStretch);

    // See which subset of family gets to use the family name as 
    // the fake logfont name.
    const int medium_stretch = (int)((unsigned)(ON_Font::Stretch::Medium));
    ON_Font::Stretch stretch0 = quartet_candidates[0]->FontStretch();
    int delta_stretch = abs(medium_stretch - ((int)((unsigned)(stretch0))));
    bool bNeedToModifyFakeName = false;
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font::Stretch stretch = quartet_candidates[j]->FontStretch();
      int ds = abs(medium_stretch - ((int)((unsigned)(stretch))));
      if (ds < delta_stretch)
      {
        stretch0 = stretch;
        delta_stretch = ds;
        bNeedToModifyFakeName = true;
      }
    }

    if (false == bNeedToModifyFakeName)
      continue; // we cannot use stretch to distinguish between family members

    // If a family member's stretch is not stretch0, modify its names.
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font* f = quartet_candidates[j];
      const ON_Font::Stretch stretch = f->FontStretch();
      if (stretch == stretch0)
        continue;
      ON_wString suffix = L" (";
      suffix += ON_Font::StretchToWideString(stretch);
      if (suffix.Length() < 3)
        continue;
      suffix += L")";
      const ON_wString loc_name = f->m_loc_windows_logfont_name+suffix;
      const ON_wString en_name = f->m_en_windows_logfont_name+suffix;
      ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(f,loc_name,en_name);
      bSortAgain = true;
    }
  }

  if (bSortAgain)
    device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);

}